

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O0

V2f Imf_3_4::CubeMap::pixelPosition(CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  V2f VVar1;
  float *in_RCX;
  undefined4 in_ESI;
  Box2i *in_RDI;
  float extraout_XMM0_Da;
  float fVar2;
  float extraout_XMM0_Db;
  Box2i dwf;
  V2f *pos;
  undefined8 in_stack_ffffffffffffffc8;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  dataWindowForFace((CubeMapFace)((ulong)in_stack_ffffffffffffffc8 >> 0x20),in_RDI);
  Imath_3_2::Vec2<float>::Vec2((Vec2<float> *)in_RDI,0.0,0.0);
  fVar2 = extraout_XMM0_Da;
  switch(in_ESI) {
  case 0:
    (in_RDI->min).x = (int)((float)local_30 + in_RCX[1]);
    fVar2 = (float)local_24 - *in_RCX;
    (in_RDI->min).y = (int)fVar2;
    break;
  case 1:
    (in_RDI->min).x = (int)((float)local_28 - in_RCX[1]);
    fVar2 = (float)local_24 - *in_RCX;
    (in_RDI->min).y = (int)fVar2;
    break;
  case 2:
    (in_RDI->min).x = (int)((float)local_30 + *in_RCX);
    fVar2 = (float)local_24 - in_RCX[1];
    (in_RDI->min).y = (int)fVar2;
    break;
  case 3:
    (in_RDI->min).x = (int)((float)local_30 + *in_RCX);
    fVar2 = (float)local_2c + in_RCX[1];
    (in_RDI->min).y = (int)fVar2;
    break;
  case 4:
    (in_RDI->min).x = (int)((float)local_28 - *in_RCX);
    fVar2 = (float)local_24 - in_RCX[1];
    (in_RDI->min).y = (int)fVar2;
    break;
  case 5:
    (in_RDI->min).x = (int)((float)local_30 + *in_RCX);
    fVar2 = (float)local_24 - in_RCX[1];
    (in_RDI->min).y = (int)fVar2;
  }
  VVar1.y = extraout_XMM0_Db;
  VVar1.x = fVar2;
  return VVar1;
}

Assistant:

V2f
pixelPosition (CubeMapFace face, const Box2i& dataWindow, V2f positionInFace)
{
    Box2i dwf = dataWindowForFace (face, dataWindow);
    V2f   pos (0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            pos.x = dwf.min.x + positionInFace.y;
            pos.y = dwf.max.y - positionInFace.x;
            break;

        case CUBEFACE_NEG_X:

            pos.x = dwf.max.x - positionInFace.y;
            pos.y = dwf.max.y - positionInFace.x;
            break;

        case CUBEFACE_POS_Y:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;

        case CUBEFACE_NEG_Y:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.min.y + positionInFace.y;
            break;

        case CUBEFACE_POS_Z:

            pos.x = dwf.max.x - positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;

        case CUBEFACE_NEG_Z:

            pos.x = dwf.min.x + positionInFace.x;
            pos.y = dwf.max.y - positionInFace.y;
            break;
    }

    return pos;
}